

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# action_score.cc
# Opt level: O0

void ACTION_SCORE::print_action_score
               (int f,v_array<ACTION_SCORE::action_score> *a_s,v_array<char> *param_3)

{
  ulong uVar1;
  size_t sVar2;
  action_score *paVar3;
  ostream *poVar4;
  long lVar5;
  ssize_t sVar6;
  int *piVar7;
  char *pcVar8;
  v_array<ACTION_SCORE::action_score> *in_RSI;
  int in_EDI;
  ssize_t t;
  ssize_t len;
  size_t i;
  stringstream ss;
  void *in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  int f_00;
  string local_208 [32];
  ssize_t local_1e8;
  string local_1e0 [32];
  long local_1c0;
  ulong local_1a8;
  stringstream local_1a0 [16];
  ostream local_190;
  v_array<ACTION_SCORE::action_score> *local_10;
  
  if (-1 < in_EDI) {
    local_10 = in_RSI;
    std::__cxx11::stringstream::stringstream(local_1a0);
    local_1a8 = 0;
    while( true ) {
      uVar1 = local_1a8;
      sVar2 = v_array<ACTION_SCORE::action_score>::size(local_10);
      f_00 = (int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
      if (sVar2 <= uVar1) break;
      if (local_1a8 != 0) {
        std::operator<<(&local_190,',');
      }
      paVar3 = v_array<ACTION_SCORE::action_score>::operator[](local_10,local_1a8);
      poVar4 = (ostream *)std::ostream::operator<<(&local_190,paVar3->action);
      poVar4 = std::operator<<(poVar4,':');
      paVar3 = v_array<ACTION_SCORE::action_score>::operator[](local_10,local_1a8);
      std::ostream::operator<<(poVar4,paVar3->score);
      local_1a8 = local_1a8 + 1;
    }
    std::operator<<(&local_190,'\n');
    std::__cxx11::stringstream::str();
    lVar5 = std::__cxx11::string::size();
    std::__cxx11::string::~string(local_1e0);
    local_1c0 = lVar5;
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    sVar6 = io_buf::write_file_or_socket(f_00,in_stack_fffffffffffffd88,0x30a5ae);
    std::__cxx11::string::~string(local_208);
    local_1e8 = sVar6;
    if (sVar6 != local_1c0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"write error: ");
      piVar7 = __errno_location();
      pcVar8 = strerror(*piVar7);
      poVar4 = std::operator<<(poVar4,pcVar8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  return;
}

Assistant:

void print_action_score(int f, v_array<action_score>& a_s, v_array<char>&)
{
  if (f >= 0)
  {
    std::stringstream ss;

    for (size_t i = 0; i < a_s.size(); i++)
    {
      if (i > 0)
        ss << ',';
      ss << a_s[i].action << ':' << a_s[i].score;
    }
    ss << '\n';
    ssize_t len = ss.str().size();
    ssize_t t = io_buf::write_file_or_socket(f, ss.str().c_str(), (unsigned int)len);
    if (t != len)
      cerr << "write error: " << strerror(errno) << endl;
  }
}